

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

bool __thiscall
duckdb::BinaryLambdaWrapper::
Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
          (BinaryLambdaWrapper *this,anon_class_16_2_9a274d3c fun,string_t left,string_t right,
          ValidityMask *mask,idx_t idx)

{
  undefined1 uVar1;
  pointer pCVar2;
  ValidityMask *pVVar3;
  long lVar4;
  undefined1 local_88 [8];
  ValidityMask *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined8 local_38;
  long local_30;
  
  local_88 = left.value._8_8_;
  local_80 = mask;
  local_38 = fun.context;
  local_30 = left.value._0_8_;
  pCVar2 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
           ::operator->((unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                         *)this);
  lVar4 = left.value._0_8_;
  if ((uint)fun.context < 0xd) {
    lVar4 = (long)&local_38 + 4;
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,lVar4,((ulong)fun.context & 0xffffffff) + lVar4);
  pVVar3 = local_80;
  if (((ulong)local_88 & 0xffffffff) < 0xd) {
    pVVar3 = (ValidityMask *)(local_88 + 4);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,pVVar3,
             (undefined1 *)
             ((long)&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask +
             ((ulong)local_88 & 0xffffffff)));
  uVar1 = duckdb::CatalogSearchPath::SchemaInSearchPath
                    ((ClientContext *)pCVar2,(string *)fun.search_path,(string *)local_58);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return (bool)uVar1;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}